

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

S2Point * __thiscall
S2Builder::GetSeparationSite
          (S2Point *__return_storage_ptr__,S2Builder *this,S2Point *site_to_avoid,S2Point *v0,
          S2Point *v1,InputEdgeId input_edge_id)

{
  double *pdVar1;
  pointer pVVar2;
  pointer ppVar3;
  double dVar4;
  VType VVar5;
  long lVar6;
  S2Point *b;
  Vector3_d *y;
  S2Point *pSVar7;
  double *ap_1;
  double *ap;
  bool bVar8;
  double dVar9;
  double dVar10;
  S2Point gap_max;
  S2Point gap_min;
  S2Point n;
  S2Point local_a0;
  S2Point local_88;
  S2LogMessage local_70;
  S2Point local_60;
  Vector3_d local_48;
  
  pVVar2 = (this->input_vertices_).
           super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar3 = (this->input_edges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar7 = pVVar2 + ppVar3[input_edge_id].first;
  b = pVVar2 + ppVar3[input_edge_id].second;
  dVar4 = b->c_[0] - pSVar7->c_[0];
  dVar9 = b->c_[1] - pSVar7->c_[1];
  dVar10 = b->c_[2] - pSVar7->c_[2];
  S2::RobustCrossProd(&local_48,pSVar7,b);
  y = &local_48;
  S2::Project(__return_storage_ptr__,site_to_avoid,pSVar7,b,&local_48);
  GetCoverageEndpoint(&local_60,this,v0,b,y,&local_48);
  local_88.c_[2] = -local_48.c_[2];
  local_88.c_[0] = -local_48.c_[0];
  local_88.c_[1] = (VType)((ulong)local_48.c_[1] ^ 0x8000000000000000);
  GetCoverageEndpoint(&local_a0,this,v1,b,y,&local_88);
  pSVar7 = &local_60;
  if (((__return_storage_ptr__->c_[2] - local_60.c_[2]) * dVar10 +
       (__return_storage_ptr__->c_[1] - local_60.c_[1]) * dVar9 +
       (__return_storage_ptr__->c_[0] - local_60.c_[0]) * dVar4 + 0.0 < 0.0) ||
     (pSVar7 = &local_a0,
     dVar10 * (local_a0.c_[2] - __return_storage_ptr__->c_[2]) +
     dVar9 * (local_a0.c_[1] - __return_storage_ptr__->c_[1]) +
     dVar4 * (local_a0.c_[0] - __return_storage_ptr__->c_[0]) + 0.0 < 0.0)) {
    __return_storage_ptr__->c_[2] = pSVar7->c_[2];
    VVar5 = pSVar7->c_[1];
    __return_storage_ptr__->c_[0] = pSVar7->c_[0];
    __return_storage_ptr__->c_[1] = VVar5;
  }
  SnapSite(&local_88,this,__return_storage_ptr__);
  __return_storage_ptr__->c_[2] = local_88.c_[2];
  __return_storage_ptr__->c_[0] = local_88.c_[0];
  __return_storage_ptr__->c_[1] = local_88.c_[1];
  if ((v0->c_[0] != __return_storage_ptr__->c_[0]) ||
     (NAN(v0->c_[0]) || NAN(__return_storage_ptr__->c_[0]))) {
    bVar8 = true;
  }
  else {
    lVar6 = 0;
    do {
      bVar8 = lVar6 == 0x10;
      if (bVar8) goto LAB_001adf8b;
      dVar4 = *(double *)((long)v0->c_ + lVar6 + 8);
      pdVar1 = (double *)((long)__return_storage_ptr__->c_ + lVar6 + 8);
      lVar6 = lVar6 + 8;
    } while ((dVar4 == *pdVar1) && (!NAN(dVar4) && !NAN(*pdVar1)));
    bVar8 = false;
LAB_001adf8b:
    bVar8 = (bool)(bVar8 ^ 1);
  }
  if (bVar8) {
    if ((v1->c_[0] != __return_storage_ptr__->c_[0]) ||
       (NAN(v1->c_[0]) || NAN(__return_storage_ptr__->c_[0]))) {
      bVar8 = true;
    }
    else {
      lVar6 = 0;
      do {
        bVar8 = lVar6 == 0x10;
        if (bVar8) goto LAB_001adfc9;
        dVar4 = *(double *)((long)v1->c_ + lVar6 + 8);
        pdVar1 = (double *)((long)__return_storage_ptr__->c_ + lVar6 + 8);
        lVar6 = lVar6 + 8;
      } while ((dVar4 == *pdVar1) && (!NAN(dVar4) && !NAN(*pdVar1)));
      bVar8 = false;
LAB_001adfc9:
      bVar8 = (bool)(bVar8 ^ 1);
    }
    if (bVar8) {
      return __return_storage_ptr__;
    }
    S2LogMessage::S2LogMessage
              (&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
               ,0x393,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_70.stream_,"Check failed: (v1) != (new_site) ",0x21);
  }
  else {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
               ,0x392,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_88.c_[1],"Check failed: (v0) != (new_site) ",0x21);
  }
  abort();
}

Assistant:

S2Point S2Builder::GetSeparationSite(const S2Point& site_to_avoid,
                                     const S2Point& v0, const S2Point& v1,
                                     InputEdgeId input_edge_id) const {
  // Define the "coverage disc" of a site S to be the disc centered at S with
  // radius "snap_radius".  Similarly, define the "coverage interval" of S for
  // an edge XY to be the intersection of XY with the coverage disc of S.  The
  // SnapFunction implementations guarantee that the only way that a snapped
  // edge can be closer than min_edge_vertex_separation() to a non-snapped
  // site (i.e., site_to_avoid) if is there is a gap in the coverage of XY
  // near this site.  We can fix this problem simply by adding a new site to
  // fill this gap, located as closely as possible to the site to avoid.
  //
  // To calculate the coverage gap, we look at the two snapped sites on
  // either side of site_to_avoid, and find the endpoints of their coverage
  // intervals.  The we place a new site in the gap, located as closely as
  // possible to the site to avoid.  Note that the new site may move when it
  // is snapped by the snap_function, but it is guaranteed not to move by
  // more than snap_radius and therefore its coverage interval will still
  // intersect the gap.
  const InputEdge& edge = input_edges_[input_edge_id];
  const S2Point& x = input_vertices_[edge.first];
  const S2Point& y = input_vertices_[edge.second];
  Vector3_d xy_dir = y - x;
  S2Point n = S2::RobustCrossProd(x, y);
  S2Point new_site = S2::Project(site_to_avoid, x, y, n);
  S2Point gap_min = GetCoverageEndpoint(v0, x, y, n);
  S2Point gap_max = GetCoverageEndpoint(v1, y, x, -n);
  if ((new_site - gap_min).DotProd(xy_dir) < 0) {
    new_site = gap_min;
  } else if ((gap_max - new_site).DotProd(xy_dir) < 0) {
    new_site = gap_max;
  }
  new_site = SnapSite(new_site);
  S2_DCHECK_NE(v0, new_site);
  S2_DCHECK_NE(v1, new_site);
  return new_site;
}